

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
gmlc::libguarded::
atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
::load(atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
       *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  lock_guard<std::mutex> glock;
  mutex_type *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  __str = in_RDI;
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string
            (unaff_retaddr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x3ae8ae);
  return in_RDI;
}

Assistant:

T load() const
    {
        std::lock_guard<M> glock(m_mutex);
        return m_obj;
    }